

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::EnumDescriptor::CopyTo(EnumDescriptor *this,EnumDescriptorProto *proto)

{
  int iVar1;
  int iVar2;
  EnumOptions *pEVar3;
  EnumOptions *pEVar4;
  EnumDescriptor *in_RDI;
  int i_2;
  EnumReservedRange *range;
  int i_1;
  int i;
  undefined4 in_stack_ffffffffffffff78;
  int32 in_stack_ffffffffffffff7c;
  EnumDescriptorProto *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  EnumValueDescriptor *in_stack_ffffffffffffffa0;
  undefined4 local_24;
  undefined4 local_18;
  undefined4 local_14;
  
  name_abi_cxx11_(in_RDI);
  EnumDescriptorProto::set_name
            (in_stack_ffffffffffffff80,
             (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  local_14 = 0;
  while( true ) {
    iVar1 = value_count(in_RDI);
    if (iVar1 <= local_14) break;
    value(in_RDI,local_14);
    EnumDescriptorProto::add_value((EnumDescriptorProto *)0x49330e);
    EnumValueDescriptor::CopyTo
              (in_stack_ffffffffffffffa0,
               (EnumValueDescriptorProto *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    local_14 = local_14 + 1;
  }
  local_18 = 0;
  while( true ) {
    iVar1 = reserved_range_count(in_RDI);
    if (iVar1 <= local_18) break;
    EnumDescriptorProto::add_reserved_range((EnumDescriptorProto *)0x493356);
    reserved_range(in_RDI,local_18);
    EnumDescriptorProto_EnumReservedRange::set_start
              ((EnumDescriptorProto_EnumReservedRange *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7c);
    reserved_range(in_RDI,local_18);
    EnumDescriptorProto_EnumReservedRange::set_end
              ((EnumDescriptorProto_EnumReservedRange *)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7c);
    local_18 = local_18 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar1 = local_24;
    iVar2 = reserved_name_count(in_RDI);
    if (iVar2 <= iVar1) break;
    reserved_name_abi_cxx11_(in_RDI,local_24);
    EnumDescriptorProto::add_reserved_name
              (in_stack_ffffffffffffff80,
               (string *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_24 = local_24 + 1;
  }
  pEVar3 = options(in_RDI);
  pEVar4 = EnumOptions::default_instance();
  if (pEVar3 != pEVar4) {
    pEVar3 = EnumDescriptorProto::mutable_options((EnumDescriptorProto *)0x493435);
    options(in_RDI);
    EnumOptions::CopyFrom
              (pEVar3,(EnumOptions *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
  }
  return;
}

Assistant:

void EnumDescriptor::CopyTo(EnumDescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < value_count(); i++) {
    value(i)->CopyTo(proto->add_value());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    EnumDescriptorProto::EnumReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &EnumOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}